

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionObjects.cpp
# Opt level: O3

ptr<Value> __thiscall ExceptionObjects::undefined_operation(ExceptionObjects *this,string *message)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ptr<Value> pVar2;
  string local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"undefined_operation","");
  pVar2 = simple_exception(this,&local_40,message);
  _Var1 = pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    _Var1._M_pi = extraout_RDX;
  }
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> ExceptionObjects::undefined_operation(const std::string &message) {
    return simple_exception("undefined_operation", message);
}